

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_sse2.c
# Opt level: O2

void blake3_hash4_sse2(uint8_t **inputs,size_t blocks,uint32_t *key,uint64_t counter,
                      _Bool increment_counter,uint8_t flags,uint8_t flags_start,uint8_t flags_end,
                      uint8_t *out)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  size_t sVar5;
  long lVar6;
  byte bVar7;
  size_t i;
  long lVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  
  auVar10 = vpbroadcastd_avx512vl(ZEXT416(*key));
  auVar11 = vpbroadcastd_avx512vl(ZEXT416(key[1]));
  auVar12 = vpbroadcastd_avx512vl(ZEXT416(key[2]));
  auVar13 = vpbroadcastd_avx512vl(ZEXT416(key[3]));
  auVar14 = vpbroadcastd_avx512vl(ZEXT416(key[4]));
  auVar15 = vpbroadcastd_avx512vl(ZEXT416(key[5]));
  auVar16 = vpbroadcastd_avx512vl(ZEXT416(key[6]));
  auVar17 = vpbroadcastd_avx512vl(ZEXT416(key[7]));
  auVar18 = vpbroadcastd_avx512vl();
  auVar50 = vpand_avx(auVar18,_DAT_0010c2c0);
  auVar18 = vpbroadcastd_avx512vl();
  auVar18 = vpaddd_avx(auVar18,auVar50);
  auVar19._8_4_ = 0x80000000;
  auVar19._0_8_ = 0x8000000080000000;
  auVar19._12_4_ = 0x80000000;
  auVar50 = vpor_avx(auVar50,auVar19);
  auVar50 = vpcmpgtd_avx(auVar50,auVar18 ^ auVar19);
  auVar19 = vpbroadcastd_avx512vl();
  auVar50 = vpsubd_avx(auVar19,auVar50);
  sVar5 = 0;
  bVar7 = flags_start | flags;
  while (sVar5 != blocks) {
    bVar9 = 0;
    if (sVar5 + 1 == blocks) {
      bVar9 = flags_end;
    }
    lVar6 = sVar5 * 0x40;
    puVar1 = *inputs;
    puVar2 = inputs[1];
    puVar3 = inputs[2];
    puVar4 = inputs[3];
    auVar19 = vmovdqu64_avx512vl(*(undefined1 (*) [16])(puVar4 + lVar6 + 0x10));
    for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    }
    auVar20 = vpbroadcastd_avx512vl(ZEXT116(bVar9 | bVar7));
    auVar21 = vpunpckldq_avx512vl(*(undefined1 (*) [16])(puVar1 + lVar6),
                                  *(undefined1 (*) [16])(puVar2 + lVar6));
    auVar45 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar6),
                             *(undefined1 (*) [16])(puVar2 + lVar6));
    auVar46 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar3 + lVar6),
                             *(undefined1 (*) [16])(puVar4 + lVar6));
    auVar22 = vpunpckhdq_avx512vl(*(undefined1 (*) [16])(puVar3 + lVar6),
                                  *(undefined1 (*) [16])(puVar4 + lVar6));
    auVar23 = vpunpcklqdq_avx512vl(auVar21,auVar46);
    auVar24 = vpunpckhqdq_avx512vl(auVar21,auVar46);
    auVar46 = vmovdqa64_avx512vl(auVar24);
    auVar25 = vpunpcklqdq_avx512vl(auVar45,auVar22);
    auVar26 = vpunpckhqdq_avx512vl(auVar45,auVar22);
    auVar21 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar1 + lVar6 + 0x10),
                             *(undefined1 (*) [16])(puVar2 + lVar6 + 0x10));
    auVar45 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar6 + 0x10),
                             *(undefined1 (*) [16])(puVar2 + lVar6 + 0x10));
    auVar22 = vpunpckldq_avx512vl(*(undefined1 (*) [16])(puVar3 + lVar6 + 0x10),auVar19);
    auVar19 = vpunpckhdq_avx512vl(*(undefined1 (*) [16])(puVar3 + lVar6 + 0x10),auVar19);
    auVar27 = vpunpcklqdq_avx512vl(auVar21,auVar22);
    auVar28 = vpunpckhqdq_avx512vl(auVar21,auVar22);
    auVar29 = vpunpcklqdq_avx512vl(auVar45,auVar19);
    auVar22 = vpunpckhqdq_avx(auVar45,auVar19);
    auVar21 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar1 + lVar6 + 0x20),
                             *(undefined1 (*) [16])(puVar2 + lVar6 + 0x20));
    auVar19 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar6 + 0x20),
                             *(undefined1 (*) [16])(puVar2 + lVar6 + 0x20));
    auVar47 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar3 + lVar6 + 0x20),
                             *(undefined1 (*) [16])(puVar4 + lVar6 + 0x20));
    auVar45 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar3 + lVar6 + 0x20),
                             *(undefined1 (*) [16])(puVar4 + lVar6 + 0x20));
    auVar42 = vpunpcklqdq_avx(auVar21,auVar47);
    auVar30 = vpunpckhqdq_avx512vl(auVar21,auVar47);
    auVar48 = vpunpcklqdq_avx(auVar19,auVar45);
    auVar31 = vpunpckhqdq_avx512vl(auVar19,auVar45);
    auVar19 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar1 + lVar6 + 0x30),
                             *(undefined1 (*) [16])(puVar2 + lVar6 + 0x30));
    auVar45 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar1 + lVar6 + 0x30),
                             *(undefined1 (*) [16])(puVar2 + lVar6 + 0x30));
    auVar47 = vpunpckldq_avx(*(undefined1 (*) [16])(puVar3 + lVar6 + 0x30),
                             *(undefined1 (*) [16])(puVar4 + lVar6 + 0x30));
    auVar21 = vpunpckhdq_avx(*(undefined1 (*) [16])(puVar3 + lVar6 + 0x30),
                             *(undefined1 (*) [16])(puVar4 + lVar6 + 0x30));
    auVar49 = vpunpcklqdq_avx(auVar19,auVar47);
    auVar47 = vpunpckhqdq_avx(auVar19,auVar47);
    auVar32 = vpunpcklqdq_avx512vl(auVar45,auVar21);
    auVar19 = vmovdqa64_avx512vl(auVar32);
    auVar45 = vpunpckhqdq_avx(auVar45,auVar21);
    auVar10 = vpaddd_avx512vl(auVar14,auVar10);
    auVar10 = vpaddd_avx(auVar23,auVar10);
    auVar11 = vpaddd_avx512vl(auVar15,auVar11);
    auVar11 = vpaddd_avx(auVar25,auVar11);
    auVar12 = vpaddd_avx512vl(auVar16,auVar12);
    auVar33 = vpaddd_avx512vl(auVar12,auVar27);
    auVar12 = vpaddd_avx512vl(auVar17,auVar13);
    auVar34 = vpaddd_avx512vl(auVar12,auVar29);
    auVar13 = vpxord_avx512vl(auVar34,auVar20);
    auVar35 = vprold_avx512vl(auVar10 ^ auVar18,0x10);
    auVar36 = vprold_avx512vl(auVar11 ^ auVar50,0x10);
    auVar12._8_4_ = 0x40;
    auVar12._0_8_ = 0x4000000040;
    auVar12._12_4_ = 0x40;
    auVar12 = vpxord_avx512vl(auVar33,auVar12);
    auVar12 = vprold_avx512vl(auVar12,0x10);
    auVar37 = vprold_avx512vl(auVar13,0x10);
    auVar13._8_4_ = 0x6a09e667;
    auVar13._0_8_ = 0x6a09e6676a09e667;
    auVar13._12_4_ = 0x6a09e667;
    auVar13 = vpaddd_avx512vl(auVar35,auVar13);
    auVar21._8_4_ = 0xbb67ae85;
    auVar21._0_8_ = 0xbb67ae85bb67ae85;
    auVar21._12_4_ = 0xbb67ae85;
    auVar21 = vpaddd_avx512vl(auVar36,auVar21);
    auVar20._8_4_ = 0x3c6ef372;
    auVar20._0_8_ = 0x3c6ef3723c6ef372;
    auVar20._12_4_ = 0x3c6ef372;
    auVar20 = vpaddd_avx512vl(auVar12,auVar20);
    auVar38._8_4_ = 0xa54ff53a;
    auVar38._0_8_ = 0xa54ff53aa54ff53a;
    auVar38._12_4_ = 0xa54ff53a;
    auVar38 = vpaddd_avx512vl(auVar37,auVar38);
    auVar14 = vpxord_avx512vl(auVar13,auVar14);
    auVar14 = vprold_avx512vl(auVar14,0x14);
    auVar15 = vpxord_avx512vl(auVar21,auVar15);
    auVar39 = vprold_avx512vl(auVar15,0x14);
    auVar15 = vpxord_avx512vl(auVar20,auVar16);
    auVar16 = vprold_avx512vl(auVar15,0x14);
    auVar15 = vpxord_avx512vl(auVar38,auVar17);
    auVar17 = vprold_avx512vl(auVar15,0x14);
    auVar24 = vpaddd_avx512vl(auVar10,auVar24);
    auVar15 = vpaddd_avx(auVar26,auVar11);
    auVar11 = vpaddd_avx512vl(auVar33,auVar28);
    auVar10 = vpaddd_avx(auVar22,auVar34);
    auVar24 = vpaddd_avx512vl(auVar24,auVar14);
    auVar33 = vpaddd_avx512vl(auVar15,auVar39);
    auVar11 = vpaddd_avx512vl(auVar11,auVar16);
    auVar34 = vpaddd_avx512vl(auVar10,auVar17);
    auVar35 = vprold_avx512vl(auVar24 ^ auVar35,0x18);
    auVar36 = vprold_avx512vl(auVar33 ^ auVar36,0x18);
    auVar15 = vpxord_avx512vl(auVar11,auVar12);
    auVar12 = vprold_avx512vl(auVar15,0x18);
    auVar15 = vpxord_avx512vl(auVar34,auVar37);
    auVar37 = vprold_avx512vl(auVar15,0x18);
    auVar13 = vpaddd_avx512vl(auVar35,auVar13);
    auVar21 = vpaddd_avx512vl(auVar36,auVar21);
    auVar20 = vpaddd_avx512vl(auVar12,auVar20);
    auVar38 = vpaddd_avx512vl(auVar37,auVar38);
    auVar15 = vpxord_avx512vl(auVar13,auVar14);
    auVar10 = vpxord_avx512vl(auVar21,auVar39);
    auVar14 = vpxord_avx512vl(auVar20,auVar16);
    auVar16 = vpxord_avx512vl(auVar38,auVar17);
    auVar17 = vprold_avx512vl(auVar15,0x19);
    auVar39 = vprold_avx512vl(auVar10,0x19);
    auVar14 = vprold_avx512vl(auVar14,0x19);
    auVar16 = vprold_avx512vl(auVar16,0x19);
    auVar15 = vpaddd_avx(auVar24,auVar42);
    auVar10 = vpaddd_avx(auVar48,auVar33);
    auVar11 = vpaddd_avx(auVar49,auVar11);
    auVar24 = vpaddd_avx512vl(auVar34,auVar32);
    auVar32 = vpaddd_avx512vl(auVar15,auVar39);
    auVar10 = vpaddd_avx512vl(auVar10,auVar14);
    auVar11 = vpaddd_avx512vl(auVar11,auVar16);
    auVar24 = vpaddd_avx512vl(auVar24,auVar17);
    auVar15 = vpxord_avx512vl(auVar37,auVar32);
    auVar12 = vpxord_avx512vl(auVar12,auVar24);
    auVar33 = vprold_avx512vl(auVar15,0x10);
    auVar34 = vprold_avx512vl(auVar10 ^ auVar35,0x10);
    auVar35 = vprold_avx512vl(auVar11 ^ auVar36,0x10);
    auVar12 = vprold_avx512vl(auVar12,0x10);
    auVar20 = vpaddd_avx512vl(auVar20,auVar33);
    auVar15 = vpaddd_avx(auVar38,auVar34);
    auVar13 = vpaddd_avx512vl(auVar13,auVar35);
    auVar21 = vpaddd_avx512vl(auVar21,auVar12);
    auVar38 = vpxord_avx512vl(auVar20,auVar39);
    auVar14 = vpxord_avx512vl(auVar15,auVar14);
    auVar16 = vpxord_avx512vl(auVar13,auVar16);
    auVar17 = vpxord_avx512vl(auVar21,auVar17);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar14 = vprold_avx512vl(auVar14,0x14);
    auVar16 = vprold_avx512vl(auVar16,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar32 = vpaddd_avx512vl(auVar32,auVar30);
    auVar36 = vpaddd_avx512vl(auVar10,auVar31);
    auVar10 = vpaddd_avx(auVar47,auVar11);
    auVar11 = vpaddd_avx(auVar45,auVar24);
    auVar24 = vpaddd_avx512vl(auVar32,auVar38);
    auVar32 = vpaddd_avx512vl(auVar36,auVar14);
    auVar36 = vpaddd_avx512vl(auVar10,auVar16);
    auVar37 = vpaddd_avx512vl(auVar11,auVar17);
    auVar10 = vpxord_avx512vl(auVar24,auVar33);
    auVar33 = vprold_avx512vl(auVar10,0x18);
    auVar34 = vprold_avx512vl(auVar32 ^ auVar34,0x18);
    auVar35 = vprold_avx512vl(auVar36 ^ auVar35,0x18);
    auVar10 = vpxord_avx512vl(auVar37,auVar12);
    auVar39 = vprold_avx512vl(auVar10,0x18);
    auVar20 = vpaddd_avx512vl(auVar33,auVar20);
    auVar10 = vpaddd_avx(auVar34,auVar15);
    auVar40 = vpaddd_avx512vl(auVar35,auVar13);
    auVar21 = vpaddd_avx512vl(auVar39,auVar21);
    auVar15 = vpxord_avx512vl(auVar20,auVar38);
    auVar11 = vpxord_avx512vl(auVar10,auVar14);
    auVar12 = vpxord_avx512vl(auVar40,auVar16);
    auVar13 = vpxord_avx512vl(auVar21,auVar17);
    auVar14 = vprold_avx512vl(auVar15,0x19);
    auVar16 = vprold_avx512vl(auVar11,0x19);
    auVar17 = vprold_avx512vl(auVar12,0x19);
    auVar38 = vprold_avx512vl(auVar13,0x19);
    auVar11 = vpaddd_avx(auVar25,auVar24);
    auVar24 = vmovdqa64_avx512vl(auVar25);
    auVar12 = vpaddd_avx(auVar26,auVar32);
    auVar13 = vpaddd_avx(auVar22,auVar36);
    auVar32 = vmovdqa64_avx512vl(auVar27);
    auVar15 = vmovdqa64_avx512vl(auVar27);
    auVar27 = vpaddd_avx512vl(auVar37,auVar27);
    auVar11 = vpaddd_avx512vl(auVar11,auVar38);
    auVar12 = vpaddd_avx512vl(auVar12,auVar14);
    auVar13 = vpaddd_avx512vl(auVar13,auVar16);
    auVar27 = vpaddd_avx512vl(auVar27,auVar17);
    auVar36 = vpxord_avx512vl(auVar13,auVar39);
    auVar33 = vpxord_avx512vl(auVar27,auVar33);
    auVar34 = vprold_avx512vl(auVar34 ^ auVar11,0x10);
    auVar35 = vprold_avx512vl(auVar35 ^ auVar12,0x10);
    auVar36 = vprold_avx512vl(auVar36,0x10);
    auVar33 = vprold_avx512vl(auVar33,0x10);
    auVar37 = vpaddd_avx512vl(auVar40,auVar34);
    auVar21 = vpaddd_avx512vl(auVar21,auVar35);
    auVar20 = vpaddd_avx512vl(auVar20,auVar36);
    auVar39 = vpaddd_avx512vl(auVar10,auVar33);
    auVar10 = vpxord_avx512vl(auVar37,auVar38);
    auVar14 = vpxord_avx512vl(auVar21,auVar14);
    auVar16 = vpxord_avx512vl(auVar20,auVar16);
    auVar17 = vpxord_avx512vl(auVar39,auVar17);
    auVar38 = vprold_avx512vl(auVar10,0x14);
    auVar14 = vprold_avx512vl(auVar14,0x14);
    auVar16 = vprold_avx512vl(auVar16,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar40 = vpaddd_avx512vl(auVar11,auVar29);
    auVar41 = vmovdqa64_avx512vl(auVar29);
    auVar10 = vmovdqa64_avx512vl(auVar29);
    auVar11 = vpaddd_avx(auVar48,auVar12);
    auVar12 = vpaddd_avx(auVar23,auVar13);
    auVar23 = vmovdqa64_avx512vl(auVar23);
    auVar13 = vpaddd_avx(auVar47,auVar27);
    auVar27 = vpaddd_avx512vl(auVar40,auVar38);
    auVar29 = vpaddd_avx512vl(auVar11,auVar14);
    auVar40 = vpaddd_avx512vl(auVar12,auVar16);
    auVar13 = vpaddd_avx512vl(auVar13,auVar17);
    auVar34 = vprold_avx512vl(auVar27 ^ auVar34,0x18);
    auVar35 = vprold_avx512vl(auVar29 ^ auVar35,0x18);
    auVar11 = vpxord_avx512vl(auVar40,auVar36);
    auVar36 = vprold_avx512vl(auVar11,0x18);
    auVar11 = vpxord_avx512vl(auVar13,auVar33);
    auVar33 = vprold_avx512vl(auVar11,0x18);
    auVar37 = vpaddd_avx512vl(auVar34,auVar37);
    auVar21 = vpaddd_avx512vl(auVar35,auVar21);
    auVar20 = vpaddd_avx512vl(auVar36,auVar20);
    auVar39 = vpaddd_avx512vl(auVar33,auVar39);
    auVar11 = vpxord_avx512vl(auVar37,auVar38);
    auVar12 = vpxord_avx512vl(auVar21,auVar14);
    auVar14 = vpxord_avx512vl(auVar20,auVar16);
    auVar16 = vpxord_avx512vl(auVar39,auVar17);
    auVar17 = vprold_avx512vl(auVar11,0x19);
    auVar38 = vprold_avx512vl(auVar12,0x19);
    auVar14 = vprold_avx512vl(auVar14,0x19);
    auVar16 = vprold_avx512vl(auVar16,0x19);
    auVar11 = vpaddd_avx(auVar46,auVar27);
    auVar12 = vpaddd_avx(auVar49,auVar29);
    auVar27 = vpaddd_avx512vl(auVar40,auVar30);
    auVar13 = vpaddd_avx(auVar45,auVar13);
    auVar29 = vpaddd_avx512vl(auVar11,auVar38);
    auVar12 = vpaddd_avx512vl(auVar12,auVar14);
    auVar27 = vpaddd_avx512vl(auVar27,auVar16);
    auVar13 = vpaddd_avx512vl(auVar13,auVar17);
    auVar11 = vpxord_avx512vl(auVar33,auVar29);
    auVar33 = vpxord_avx512vl(auVar36,auVar13);
    auVar36 = vprold_avx512vl(auVar11,0x10);
    auVar34 = vprold_avx512vl(auVar12 ^ auVar34,0x10);
    auVar35 = vprold_avx512vl(auVar27 ^ auVar35,0x10);
    auVar33 = vprold_avx512vl(auVar33,0x10);
    auVar20 = vpaddd_avx512vl(auVar20,auVar36);
    auVar11 = vpaddd_avx(auVar39,auVar34);
    auVar37 = vpaddd_avx512vl(auVar37,auVar35);
    auVar21 = vpaddd_avx512vl(auVar21,auVar33);
    auVar38 = vpxord_avx512vl(auVar20,auVar38);
    auVar14 = vpxord_avx512vl(auVar11,auVar14);
    auVar16 = vpxord_avx512vl(auVar37,auVar16);
    auVar17 = vpxord_avx512vl(auVar21,auVar17);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar14 = vprold_avx512vl(auVar14,0x14);
    auVar16 = vprold_avx512vl(auVar16,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar29 = vpaddd_avx512vl(auVar29,auVar31);
    auVar39 = vpaddd_avx512vl(auVar12,auVar28);
    auVar12 = vpaddd_avx(auVar19,auVar27);
    auVar42 = vmovdqa64_avx512vl(auVar42);
    auVar13 = vpaddd_avx512vl(auVar13,auVar42);
    auVar27 = vpaddd_avx512vl(auVar29,auVar38);
    auVar29 = vpaddd_avx512vl(auVar39,auVar14);
    auVar39 = vpaddd_avx512vl(auVar12,auVar16);
    auVar40 = vpaddd_avx512vl(auVar13,auVar17);
    auVar12 = vpxord_avx512vl(auVar27,auVar36);
    auVar36 = vprold_avx512vl(auVar12,0x18);
    auVar34 = vprold_avx512vl(auVar29 ^ auVar34,0x18);
    auVar35 = vprold_avx512vl(auVar39 ^ auVar35,0x18);
    auVar12 = vpxord_avx512vl(auVar40,auVar33);
    auVar33 = vprold_avx512vl(auVar12,0x18);
    auVar20 = vpaddd_avx512vl(auVar36,auVar20);
    auVar11 = vpaddd_avx(auVar34,auVar11);
    auVar37 = vpaddd_avx512vl(auVar35,auVar37);
    auVar21 = vpaddd_avx512vl(auVar33,auVar21);
    auVar12 = vpxord_avx512vl(auVar20,auVar38);
    auVar13 = vpxord_avx512vl(auVar11,auVar14);
    auVar14 = vpxord_avx512vl(auVar37,auVar16);
    auVar16 = vpxord_avx512vl(auVar21,auVar17);
    auVar17 = vprold_avx512vl(auVar12,0x19);
    auVar38 = vprold_avx512vl(auVar13,0x19);
    auVar43 = vprold_avx512vl(auVar14,0x19);
    auVar44 = vprold_avx512vl(auVar16,0x19);
    auVar12 = vpaddd_avx(auVar26,auVar27);
    auVar13 = vpaddd_avx(auVar48,auVar29);
    auVar14 = vpaddd_avx(auVar39,auVar47);
    auVar16 = vpaddd_avx(auVar22,auVar40);
    auVar12 = vpaddd_avx512vl(auVar12,auVar44);
    auVar13 = vpaddd_avx512vl(auVar13,auVar17);
    auVar14 = vpaddd_avx512vl(auVar14,auVar38);
    auVar16 = vpaddd_avx512vl(auVar16,auVar43);
    auVar27 = vpxord_avx512vl(auVar14,auVar33);
    auVar29 = vpxord_avx512vl(auVar16,auVar36);
    auVar33 = vprold_avx512vl(auVar34 ^ auVar12,0x10);
    auVar34 = vprold_avx512vl(auVar35 ^ auVar13,0x10);
    auVar27 = vprold_avx512vl(auVar27,0x10);
    auVar29 = vprold_avx512vl(auVar29,0x10);
    auVar35 = vpaddd_avx512vl(auVar37,auVar33);
    auVar21 = vpaddd_avx512vl(auVar21,auVar34);
    auVar20 = vpaddd_avx512vl(auVar20,auVar27);
    auVar36 = vpaddd_avx512vl(auVar11,auVar29);
    auVar11 = vpxord_avx512vl(auVar35,auVar44);
    auVar17 = vpxord_avx512vl(auVar21,auVar17);
    auVar38 = vpxord_avx512vl(auVar20,auVar38);
    auVar37 = vpxord_avx512vl(auVar36,auVar43);
    auVar39 = vprold_avx512vl(auVar11,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar37 = vprold_avx512vl(auVar37,0x14);
    auVar11 = vpaddd_avx(auVar32,auVar12);
    auVar12 = vpaddd_avx(auVar49,auVar13);
    auVar14 = vpaddd_avx512vl(auVar14,auVar24);
    auVar13 = vpaddd_avx(auVar19,auVar16);
    auVar11 = vpaddd_avx512vl(auVar11,auVar39);
    auVar12 = vpaddd_avx512vl(auVar12,auVar17);
    auVar14 = vpaddd_avx512vl(auVar14,auVar38);
    auVar13 = vpaddd_avx512vl(auVar13,auVar37);
    auVar16 = vprold_avx512vl(auVar11 ^ auVar33,0x18);
    auVar24 = vprold_avx512vl(auVar12 ^ auVar34,0x18);
    auVar27 = vpxord_avx512vl(auVar14,auVar27);
    auVar27 = vprold_avx512vl(auVar27,0x18);
    auVar29 = vpxord_avx512vl(auVar13,auVar29);
    auVar29 = vprold_avx512vl(auVar29,0x18);
    auVar32 = vpaddd_avx512vl(auVar16,auVar35);
    auVar21 = vpaddd_avx512vl(auVar24,auVar21);
    auVar20 = vpaddd_avx512vl(auVar27,auVar20);
    auVar33 = vpaddd_avx512vl(auVar29,auVar36);
    auVar34 = vpxord_avx512vl(auVar32,auVar39);
    auVar17 = vpxord_avx512vl(auVar21,auVar17);
    auVar38 = vpxord_avx512vl(auVar20,auVar38);
    auVar35 = vpxord_avx512vl(auVar33,auVar37);
    auVar34 = vprold_avx512vl(auVar34,0x19);
    auVar17 = vprold_avx512vl(auVar17,0x19);
    auVar38 = vprold_avx512vl(auVar38,0x19);
    auVar35 = vprold_avx512vl(auVar35,0x19);
    auVar11 = vpaddd_avx512vl(auVar11,auVar41);
    auVar12 = vpaddd_avx512vl(auVar12,auVar30);
    auVar14 = vpaddd_avx512vl(auVar14,auVar31);
    auVar13 = vpaddd_avx512vl(auVar13,auVar42);
    auVar42 = vmovdqa64_avx512vl(auVar42);
    auVar36 = vpaddd_avx512vl(auVar11,auVar17);
    auVar12 = vpaddd_avx512vl(auVar12,auVar38);
    auVar14 = vpaddd_avx512vl(auVar14,auVar35);
    auVar13 = vpaddd_avx512vl(auVar13,auVar34);
    auVar11 = vpxord_avx512vl(auVar29,auVar36);
    auVar27 = vpxord_avx512vl(auVar27,auVar13);
    auVar29 = vprold_avx512vl(auVar11,0x10);
    auVar16 = vprold_avx512vl(auVar12 ^ auVar16,0x10);
    auVar24 = vprold_avx512vl(auVar14 ^ auVar24,0x10);
    auVar27 = vprold_avx512vl(auVar27,0x10);
    auVar20 = vpaddd_avx512vl(auVar20,auVar29);
    auVar11 = vpaddd_avx(auVar33,auVar16);
    auVar32 = vpaddd_avx512vl(auVar32,auVar24);
    auVar21 = vpaddd_avx512vl(auVar21,auVar27);
    auVar17 = vpxord_avx512vl(auVar20,auVar17);
    auVar38 = vpxord_avx512vl(auVar11,auVar38);
    auVar33 = vpxord_avx512vl(auVar32,auVar35);
    auVar34 = vpxord_avx512vl(auVar21,auVar34);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar33 = vprold_avx512vl(auVar33,0x14);
    auVar34 = vprold_avx512vl(auVar34,0x14);
    auVar35 = vpaddd_avx512vl(auVar36,auVar28);
    auVar36 = vpaddd_avx512vl(auVar12,auVar23);
    auVar45 = vmovdqa64_avx512vl(auVar45);
    auVar14 = vpaddd_avx512vl(auVar14,auVar45);
    auVar12 = vpaddd_avx(auVar46,auVar13);
    auVar13 = vpaddd_avx512vl(auVar35,auVar17);
    auVar35 = vpaddd_avx512vl(auVar36,auVar38);
    auVar14 = vpaddd_avx512vl(auVar14,auVar33);
    auVar36 = vpaddd_avx512vl(auVar12,auVar34);
    auVar12 = vpxord_avx512vl(auVar13,auVar29);
    auVar29 = vprold_avx512vl(auVar12,0x18);
    auVar16 = vprold_avx512vl(auVar35 ^ auVar16,0x18);
    auVar24 = vprold_avx512vl(auVar14 ^ auVar24,0x18);
    auVar12 = vpxord_avx512vl(auVar36,auVar27);
    auVar27 = vprold_avx512vl(auVar12,0x18);
    auVar20 = vpaddd_avx512vl(auVar29,auVar20);
    auVar11 = vpaddd_avx(auVar16,auVar11);
    auVar32 = vpaddd_avx512vl(auVar24,auVar32);
    auVar21 = vpaddd_avx512vl(auVar27,auVar21);
    auVar12 = vpxord_avx512vl(auVar20,auVar17);
    auVar17 = vpxord_avx512vl(auVar11,auVar38);
    auVar38 = vpxord_avx512vl(auVar32,auVar33);
    auVar33 = vpxord_avx512vl(auVar21,auVar34);
    auVar34 = vprold_avx512vl(auVar12,0x19);
    auVar17 = vprold_avx512vl(auVar17,0x19);
    auVar38 = vprold_avx512vl(auVar38,0x19);
    auVar33 = vprold_avx512vl(auVar33,0x19);
    auVar12 = vpaddd_avx(auVar48,auVar13);
    auVar13 = vpaddd_avx(auVar49,auVar35);
    auVar14 = vpaddd_avx(auVar19,auVar14);
    auVar35 = vmovdqa64_avx512vl(auVar19);
    auVar19 = vpaddd_avx(auVar36,auVar47);
    auVar12 = vpaddd_avx512vl(auVar12,auVar33);
    auVar13 = vpaddd_avx512vl(auVar13,auVar34);
    auVar14 = vpaddd_avx512vl(auVar14,auVar17);
    auVar36 = vpaddd_avx512vl(auVar19,auVar38);
    auVar19 = vpxord_avx512vl(auVar14,auVar27);
    auVar27 = vpxord_avx512vl(auVar36,auVar29);
    auVar16 = vprold_avx512vl(auVar16 ^ auVar12,0x10);
    auVar24 = vprold_avx512vl(auVar24 ^ auVar13,0x10);
    auVar29 = vprold_avx512vl(auVar19,0x10);
    auVar27 = vprold_avx512vl(auVar27,0x10);
    auVar32 = vpaddd_avx512vl(auVar32,auVar16);
    auVar21 = vpaddd_avx512vl(auVar21,auVar24);
    auVar20 = vpaddd_avx512vl(auVar20,auVar29);
    auVar37 = vpaddd_avx512vl(auVar11,auVar27);
    auVar19 = vpxord_avx512vl(auVar32,auVar33);
    auVar11 = vpxord_avx512vl(auVar21,auVar34);
    auVar17 = vpxord_avx512vl(auVar20,auVar17);
    auVar38 = vpxord_avx512vl(auVar37,auVar38);
    auVar33 = vprold_avx512vl(auVar19,0x14);
    auVar34 = vprold_avx512vl(auVar11,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar19 = vpaddd_avx(auVar22,auVar12);
    auVar12 = vpaddd_avx512vl(auVar13,auVar30);
    auVar11 = vpaddd_avx(auVar26,auVar14);
    auVar13 = vpaddd_avx512vl(auVar36,auVar45);
    auVar19 = vpaddd_avx512vl(auVar19,auVar33);
    auVar12 = vpaddd_avx512vl(auVar12,auVar34);
    auVar11 = vpaddd_avx512vl(auVar11,auVar17);
    auVar13 = vpaddd_avx512vl(auVar13,auVar38);
    auVar14 = vprold_avx512vl(auVar19 ^ auVar16,0x18);
    auVar16 = vprold_avx512vl(auVar12 ^ auVar24,0x18);
    auVar24 = vpxord_avx512vl(auVar11,auVar29);
    auVar24 = vprold_avx512vl(auVar24,0x18);
    auVar27 = vpxord_avx512vl(auVar13,auVar27);
    auVar27 = vprold_avx512vl(auVar27,0x18);
    auVar29 = vpaddd_avx512vl(auVar14,auVar32);
    auVar21 = vpaddd_avx512vl(auVar16,auVar21);
    auVar20 = vpaddd_avx512vl(auVar24,auVar20);
    auVar32 = vpaddd_avx512vl(auVar27,auVar37);
    auVar33 = vpxord_avx512vl(auVar29,auVar33);
    auVar34 = vpxord_avx512vl(auVar21,auVar34);
    auVar17 = vpxord_avx512vl(auVar20,auVar17);
    auVar38 = vpxord_avx512vl(auVar32,auVar38);
    auVar33 = vprold_avx512vl(auVar33,0x19);
    auVar34 = vprold_avx512vl(auVar34,0x19);
    auVar17 = vprold_avx512vl(auVar17,0x19);
    auVar38 = vprold_avx512vl(auVar38,0x19);
    auVar19 = vpaddd_avx(auVar15,auVar19);
    auVar36 = vmovdqa64_avx512vl(auVar31);
    auVar12 = vpaddd_avx512vl(auVar12,auVar31);
    auVar31 = vpaddd_avx512vl(auVar11,auVar28);
    auVar11 = vpaddd_avx(auVar46,auVar13);
    auVar13 = vpaddd_avx512vl(auVar19,auVar34);
    auVar12 = vpaddd_avx512vl(auVar12,auVar17);
    auVar31 = vpaddd_avx512vl(auVar31,auVar38);
    auVar37 = vpaddd_avx512vl(auVar11,auVar33);
    auVar19 = vpxord_avx512vl(auVar27,auVar13);
    auVar11 = vpxord_avx512vl(auVar24,auVar37);
    auVar24 = vprold_avx512vl(auVar19,0x10);
    auVar14 = vprold_avx512vl(auVar12 ^ auVar14,0x10);
    auVar16 = vprold_avx512vl(auVar31 ^ auVar16,0x10);
    auVar27 = vprold_avx512vl(auVar11,0x10);
    auVar20 = vpaddd_avx512vl(auVar20,auVar24);
    auVar19 = vpaddd_avx(auVar32,auVar14);
    auVar29 = vpaddd_avx512vl(auVar29,auVar16);
    auVar21 = vpaddd_avx512vl(auVar21,auVar27);
    auVar11 = vpxord_avx512vl(auVar20,auVar34);
    auVar17 = vpxord_avx512vl(auVar19,auVar17);
    auVar38 = vpxord_avx512vl(auVar29,auVar38);
    auVar32 = vpxord_avx512vl(auVar21,auVar33);
    auVar33 = vprold_avx512vl(auVar11,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar32 = vprold_avx512vl(auVar32,0x14);
    auVar34 = vpaddd_avx512vl(auVar13,auVar23);
    auVar11 = vpaddd_avx(auVar25,auVar12);
    auVar39 = vmovdqa64_avx512vl(auVar42);
    auVar12 = vpaddd_avx(auVar42,auVar31);
    auVar13 = vpaddd_avx(auVar10,auVar37);
    auVar42 = vpaddd_avx512vl(auVar34,auVar33);
    auVar31 = vpaddd_avx512vl(auVar11,auVar17);
    auVar12 = vpaddd_avx512vl(auVar12,auVar38);
    auVar13 = vpaddd_avx512vl(auVar13,auVar32);
    auVar11 = vpxord_avx512vl(auVar42,auVar24);
    auVar24 = vprold_avx512vl(auVar11,0x18);
    auVar14 = vprold_avx512vl(auVar31 ^ auVar14,0x18);
    auVar16 = vprold_avx512vl(auVar12 ^ auVar16,0x18);
    auVar11 = vpxord_avx512vl(auVar13,auVar27);
    auVar27 = vprold_avx512vl(auVar11,0x18);
    auVar20 = vpaddd_avx512vl(auVar24,auVar20);
    auVar19 = vpaddd_avx(auVar14,auVar19);
    auVar29 = vpaddd_avx512vl(auVar16,auVar29);
    auVar21 = vpaddd_avx512vl(auVar27,auVar21);
    auVar11 = vpxord_avx512vl(auVar20,auVar33);
    auVar17 = vpxord_avx512vl(auVar19,auVar17);
    auVar38 = vpxord_avx512vl(auVar29,auVar38);
    auVar32 = vpxord_avx512vl(auVar21,auVar32);
    auVar33 = vprold_avx512vl(auVar11,0x19);
    auVar17 = vprold_avx512vl(auVar17,0x19);
    auVar38 = vprold_avx512vl(auVar38,0x19);
    auVar32 = vprold_avx512vl(auVar32,0x19);
    auVar11 = vpaddd_avx(auVar49,auVar42);
    auVar42 = vpaddd_avx512vl(auVar31,auVar30);
    auVar12 = vpaddd_avx512vl(auVar12,auVar45);
    auVar13 = vpaddd_avx512vl(auVar13,auVar35);
    auVar11 = vpaddd_avx512vl(auVar11,auVar32);
    auVar42 = vpaddd_avx512vl(auVar42,auVar33);
    auVar12 = vpaddd_avx512vl(auVar12,auVar17);
    auVar13 = vpaddd_avx512vl(auVar13,auVar38);
    auVar27 = vpxord_avx512vl(auVar12,auVar27);
    auVar24 = vpxord_avx512vl(auVar13,auVar24);
    auVar14 = vprold_avx512vl(auVar14 ^ auVar11,0x10);
    auVar16 = vprold_avx512vl(auVar16 ^ auVar42,0x10);
    auVar27 = vprold_avx512vl(auVar27,0x10);
    auVar24 = vprold_avx512vl(auVar24,0x10);
    auVar29 = vpaddd_avx512vl(auVar29,auVar14);
    auVar21 = vpaddd_avx512vl(auVar21,auVar16);
    auVar20 = vpaddd_avx512vl(auVar20,auVar27);
    auVar31 = vpaddd_avx512vl(auVar19,auVar24);
    auVar19 = vpxord_avx512vl(auVar29,auVar32);
    auVar32 = vpxord_avx512vl(auVar21,auVar33);
    auVar17 = vpxord_avx512vl(auVar20,auVar17);
    auVar38 = vpxord_avx512vl(auVar31,auVar38);
    auVar33 = vprold_avx512vl(auVar19,0x14);
    auVar32 = vprold_avx512vl(auVar32,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar19 = vpaddd_avx(auVar11,auVar47);
    auVar42 = vpaddd_avx512vl(auVar42,auVar36);
    auVar11 = vpaddd_avx(auVar48,auVar12);
    auVar12 = vpaddd_avx512vl(auVar13,auVar39);
    auVar19 = vpaddd_avx512vl(auVar19,auVar33);
    auVar13 = vpaddd_avx512vl(auVar42,auVar32);
    auVar11 = vpaddd_avx512vl(auVar11,auVar17);
    auVar12 = vpaddd_avx512vl(auVar12,auVar38);
    auVar14 = vprold_avx512vl(auVar19 ^ auVar14,0x18);
    auVar16 = vprold_avx512vl(auVar13 ^ auVar16,0x18);
    auVar42 = vpxord_avx512vl(auVar11,auVar27);
    auVar42 = vprold_avx512vl(auVar42,0x18);
    auVar24 = vpxord_avx512vl(auVar12,auVar24);
    auVar24 = vprold_avx512vl(auVar24,0x18);
    auVar27 = vpaddd_avx512vl(auVar14,auVar29);
    auVar21 = vpaddd_avx512vl(auVar16,auVar21);
    auVar20 = vpaddd_avx512vl(auVar42,auVar20);
    auVar29 = vpaddd_avx512vl(auVar24,auVar31);
    auVar31 = vpxord_avx512vl(auVar27,auVar33);
    auVar32 = vpxord_avx512vl(auVar21,auVar32);
    auVar17 = vpxord_avx512vl(auVar20,auVar17);
    auVar38 = vpxord_avx512vl(auVar29,auVar38);
    auVar31 = vprold_avx512vl(auVar31,0x19);
    auVar32 = vprold_avx512vl(auVar32,0x19);
    auVar17 = vprold_avx512vl(auVar17,0x19);
    auVar38 = vprold_avx512vl(auVar38,0x19);
    auVar19 = vpaddd_avx(auVar22,auVar19);
    auVar13 = vpaddd_avx512vl(auVar13,auVar28);
    auVar33 = vpaddd_avx512vl(auVar11,auVar23);
    auVar11 = vpaddd_avx(auVar10,auVar12);
    auVar12 = vpaddd_avx512vl(auVar19,auVar32);
    auVar13 = vpaddd_avx512vl(auVar13,auVar17);
    auVar33 = vpaddd_avx512vl(auVar33,auVar38);
    auVar34 = vpaddd_avx512vl(auVar11,auVar31);
    auVar19 = vpxord_avx512vl(auVar24,auVar12);
    auVar11 = vpxord_avx512vl(auVar42,auVar34);
    auVar42 = vprold_avx512vl(auVar19,0x10);
    auVar24 = vprold_avx512vl(auVar13 ^ auVar14,0x10);
    auVar16 = vprold_avx512vl(auVar33 ^ auVar16,0x10);
    auVar37 = vprold_avx512vl(auVar11,0x10);
    auVar20 = vpaddd_avx512vl(auVar20,auVar42);
    auVar19 = vpaddd_avx(auVar29,auVar24);
    auVar27 = vpaddd_avx512vl(auVar27,auVar16);
    auVar21 = vpaddd_avx512vl(auVar21,auVar37);
    auVar11 = vpxord_avx512vl(auVar20,auVar32);
    auVar14 = vpxord_avx512vl(auVar19,auVar17);
    auVar17 = vpxord_avx512vl(auVar27,auVar38);
    auVar38 = vpxord_avx512vl(auVar21,auVar31);
    auVar29 = vprold_avx512vl(auVar11,0x14);
    auVar31 = vprold_avx512vl(auVar14,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar11 = vpaddd_avx(auVar25,auVar12);
    auVar12 = vpaddd_avx(auVar26,auVar13);
    auVar13 = vpaddd_avx(auVar46,auVar33);
    auVar14 = vpaddd_avx(auVar15,auVar34);
    auVar11 = vpaddd_avx512vl(auVar11,auVar29);
    auVar12 = vpaddd_avx512vl(auVar12,auVar31);
    auVar13 = vpaddd_avx512vl(auVar13,auVar17);
    auVar14 = vpaddd_avx512vl(auVar14,auVar38);
    auVar42 = vpxord_avx512vl(auVar11,auVar42);
    auVar42 = vprold_avx512vl(auVar42,0x18);
    auVar24 = vprold_avx512vl(auVar12 ^ auVar24,0x18);
    auVar16 = vprold_avx512vl(auVar13 ^ auVar16,0x18);
    auVar32 = vpxord_avx512vl(auVar14,auVar37);
    auVar32 = vprold_avx512vl(auVar32,0x18);
    auVar20 = vpaddd_avx512vl(auVar42,auVar20);
    auVar19 = vpaddd_avx(auVar24,auVar19);
    auVar27 = vpaddd_avx512vl(auVar16,auVar27);
    auVar21 = vpaddd_avx512vl(auVar32,auVar21);
    auVar29 = vpxord_avx512vl(auVar20,auVar29);
    auVar31 = vpxord_avx512vl(auVar19,auVar31);
    auVar17 = vpxord_avx512vl(auVar27,auVar17);
    auVar38 = vpxord_avx512vl(auVar21,auVar38);
    auVar29 = vprold_avx512vl(auVar29,0x19);
    auVar31 = vprold_avx512vl(auVar31,0x19);
    auVar17 = vprold_avx512vl(auVar17,0x19);
    auVar38 = vprold_avx512vl(auVar38,0x19);
    auVar11 = vpaddd_avx512vl(auVar11,auVar30);
    auVar12 = vpaddd_avx512vl(auVar12,auVar36);
    auVar13 = vpaddd_avx512vl(auVar13,auVar39);
    auVar14 = vpaddd_avx512vl(auVar14,auVar45);
    auVar11 = vpaddd_avx512vl(auVar11,auVar38);
    auVar12 = vpaddd_avx512vl(auVar12,auVar29);
    auVar13 = vpaddd_avx512vl(auVar13,auVar31);
    auVar14 = vpaddd_avx512vl(auVar14,auVar17);
    auVar32 = vpxord_avx512vl(auVar13,auVar32);
    auVar42 = vpxord_avx512vl(auVar14,auVar42);
    auVar24 = vprold_avx512vl(auVar24 ^ auVar11,0x10);
    auVar16 = vprold_avx512vl(auVar16 ^ auVar12,0x10);
    auVar32 = vprold_avx512vl(auVar32,0x10);
    auVar42 = vprold_avx512vl(auVar42,0x10);
    auVar27 = vpaddd_avx512vl(auVar27,auVar24);
    auVar21 = vpaddd_avx512vl(auVar21,auVar16);
    auVar20 = vpaddd_avx512vl(auVar20,auVar32);
    auVar33 = vpaddd_avx512vl(auVar19,auVar42);
    auVar19 = vpxord_avx512vl(auVar27,auVar38);
    auVar38 = vpxord_avx512vl(auVar21,auVar29);
    auVar29 = vpxord_avx512vl(auVar20,auVar31);
    auVar17 = vpxord_avx512vl(auVar33,auVar17);
    auVar31 = vprold_avx512vl(auVar19,0x14);
    auVar38 = vprold_avx512vl(auVar38,0x14);
    auVar29 = vprold_avx512vl(auVar29,0x14);
    auVar17 = vprold_avx512vl(auVar17,0x14);
    auVar34 = vmovdqa64_avx512vl(auVar35);
    auVar11 = vpaddd_avx512vl(auVar11,auVar35);
    auVar12 = vpaddd_avx512vl(auVar12,auVar28);
    auVar19 = vpaddd_avx(auVar49,auVar13);
    auVar13 = vpaddd_avx512vl(auVar14,auVar46);
    auVar14 = vmovdqa64_avx512vl(auVar46);
    auVar46 = vpaddd_avx512vl(auVar11,auVar31);
    auVar35 = vpaddd_avx512vl(auVar12,auVar38);
    auVar19 = vpaddd_avx(auVar19,auVar29);
    auVar37 = vpaddd_avx512vl(auVar13,auVar17);
    auVar16 = vprold_avx512vl(auVar35 ^ auVar16,0x18);
    auVar11 = vpxord_avx512vl(auVar19,auVar32);
    auVar32 = vprold_avx512vl(auVar11,0x18);
    auVar11 = vpxord_avx512vl(auVar37,auVar42);
    auVar13 = vprold_avx512vl(auVar11,0x18);
    auVar21 = vpaddd_avx512vl(auVar16,auVar21);
    auVar42 = vpaddd_avx512vl(auVar32,auVar20);
    auVar11 = vpaddd_avx(auVar13,auVar33);
    auVar12 = vpxord_avx512vl(auVar21,auVar38);
    auVar20 = vprold_avx512vl(auVar12,0x19);
    auVar38 = vmovdqa64_avx512vl(auVar47);
    auVar12 = vpaddd_avx(auVar47,auVar46);
    auVar12 = vpaddd_avx(auVar12,auVar20);
    auVar47 = vprold_avx512vl(auVar13 ^ auVar12,0x10);
    auVar33 = vpaddd_avx512vl(auVar42,auVar47);
    auVar13 = vpxord_avx512vl(auVar33,auVar20);
    auVar20 = vprold_avx512vl(auVar13,0x14);
    auVar12 = vpaddd_avx(auVar26,auVar12);
    auVar40 = vpaddd_avx512vl(auVar12,auVar20);
    auVar36 = vpaddd_avx512vl(auVar40,auVar36);
    auVar13 = vprold_avx512vl(auVar46 ^ auVar24,0x18);
    auVar46 = vpaddd_avx512vl(auVar13,auVar27);
    auVar42 = vprold_avx512vl(auVar42 ^ auVar29,0x19);
    auVar24 = vmovdqa64_avx512vl(auVar23);
    auVar12 = vpaddd_avx512vl(auVar35,auVar23);
    auVar12 = vpaddd_avx(auVar12,auVar42);
    auVar23 = vprold_avx512vl(auVar12 ^ auVar13,0x10);
    auVar13 = vpaddd_avx(auVar11,auVar23);
    auVar42 = vprold_avx512vl(auVar13 ^ auVar42,0x14);
    auVar12 = vpaddd_avx(auVar12,auVar48);
    auVar12 = vpaddd_avx(auVar12,auVar42);
    auVar27 = vpaddd_avx512vl(auVar12,auVar28);
    auVar28 = vpxord_avx512vl(auVar46,auVar31);
    auVar11 = vprold_avx512vl(auVar17 ^ auVar11,0x19);
    auVar19 = vpaddd_avx(auVar25,auVar19);
    auVar19 = vpaddd_avx(auVar11,auVar19);
    auVar16 = vpxord_avx512vl(auVar19,auVar16);
    auVar16 = vprold_avx512vl(auVar16,0x10);
    auVar17 = vpaddd_avx512vl(auVar46,auVar16);
    auVar11 = vprold_avx512vl(auVar11 ^ auVar17,0x14);
    auVar10 = vmovdqa64_avx512vl(auVar10);
    auVar19 = vpaddd_avx512vl(auVar19,auVar10);
    auVar19 = vpaddd_avx(auVar11,auVar19);
    auVar16 = vpxord_avx512vl(auVar19,auVar16);
    auVar14 = vpaddd_avx512vl(auVar19,auVar14);
    auVar46 = vprold_avx512vl(auVar28,0x19);
    auVar28 = vmovdqa64_avx512vl(auVar15);
    auVar19 = vpaddd_avx512vl(auVar37,auVar28);
    auVar19 = vpaddd_avx(auVar19,auVar46);
    auVar15 = vpxord_avx512vl(auVar32,auVar19);
    auVar15 = vprold_avx512vl(auVar15,0x10);
    auVar21 = vpaddd_avx512vl(auVar21,auVar15);
    auVar46 = vpxord_avx512vl(auVar21,auVar46);
    auVar46 = vprold_avx512vl(auVar46,0x14);
    auVar19 = vpaddd_avx(auVar19,auVar22);
    auVar19 = vpaddd_avx512vl(auVar19,auVar46);
    auVar15 = vpxord_avx512vl(auVar19,auVar15);
    auVar29 = vpaddd_avx512vl(auVar19,auVar39);
    auVar12 = vprold_avx512vl(auVar12 ^ auVar23,0x18);
    auVar23 = vprold_avx512vl(auVar15,0x18);
    auVar31 = vpaddd_avx512vl(auVar12,auVar13);
    auVar13 = vpaddd_avx512vl(auVar23,auVar21);
    auVar19 = vpxord_avx512vl(auVar13,auVar46);
    auVar46 = vprold_avx512vl(auVar19,0x19);
    auVar19 = vpaddd_avx(auVar36,auVar46);
    auVar45 = vpaddd_avx512vl(auVar19,auVar45);
    auVar21 = vprold_avx512vl(auVar40 ^ auVar47,0x18);
    auVar15 = vprold_avx512vl(auVar16,0x18);
    auVar16 = vpaddd_avx512vl(auVar21,auVar33);
    auVar17 = vpaddd_avx512vl(auVar15,auVar17);
    auVar47 = vpxord_avx512vl(auVar16,auVar20);
    auVar47 = vprold_avx512vl(auVar47,0x19);
    auVar20 = vpaddd_avx512vl(auVar27,auVar47);
    auVar27 = vpxord_avx512vl(auVar15,auVar20);
    auVar15 = vpaddd_avx(auVar24,auVar20);
    auVar42 = vpxord_avx512vl(auVar31,auVar42);
    auVar42 = vprold_avx512vl(auVar42,0x19);
    auVar14 = vpaddd_avx512vl(auVar14,auVar42);
    auVar20 = vpaddd_avx512vl(auVar14,auVar30);
    auVar24 = vprold_avx512vl(auVar11 ^ auVar17,0x19);
    auVar11 = vpaddd_avx512vl(auVar29,auVar24);
    auVar21 = vpxord_avx512vl(auVar11,auVar21);
    auVar29 = vpaddd_avx512vl(auVar11,auVar10);
    auVar30 = vprold_avx512vl(auVar12 ^ auVar19,0x10);
    auVar19 = vpaddd_avx(auVar17,auVar30);
    auVar17 = vprold_avx512vl(auVar19 ^ auVar46,0x14);
    auVar10 = vpaddd_avx(auVar45,auVar17);
    auVar11 = vpaddd_avx(auVar34,auVar10);
    auVar46 = vprold_avx512vl(auVar27,0x10);
    auVar12 = vpaddd_avx(auVar13,auVar46);
    auVar13 = vpxord_avx512vl(auVar12,auVar47);
    auVar45 = vprold_avx512vl(auVar13,0x14);
    auVar15 = vpaddd_avx(auVar15,auVar45);
    auVar13 = vpaddd_avx(auVar25,auVar15);
    auVar47 = vprold_avx512vl(auVar23 ^ auVar14,0x10);
    auVar16 = vpaddd_avx512vl(auVar16,auVar47);
    auVar42 = vprold_avx512vl(auVar16 ^ auVar42,0x14);
    auVar20 = vpaddd_avx512vl(auVar20,auVar42);
    auVar14 = vpaddd_avx(auVar20,auVar26);
    auVar21 = vprold_avx512vl(auVar21,0x10);
    auVar23 = vpaddd_avx512vl(auVar31,auVar21);
    auVar24 = vpxord_avx512vl(auVar23,auVar24);
    auVar24 = vprold_avx512vl(auVar24,0x14);
    auVar25 = vpaddd_avx512vl(auVar29,auVar24);
    auVar21 = vpxord_avx512vl(auVar25,auVar21);
    auVar22 = vpaddd_avx512vl(auVar25,auVar22);
    auVar46 = vprold_avx512vl(auVar15 ^ auVar46,0x18);
    auVar21 = vprold_avx512vl(auVar21,0x18);
    auVar15 = vpaddd_avx(auVar46,auVar12);
    auVar23 = vpaddd_avx512vl(auVar21,auVar23);
    auVar45 = vprold_avx512vl(auVar15 ^ auVar45,0x19);
    auVar11 = vpaddd_avx(auVar11,auVar45);
    auVar21 = vpxord_avx512vl(auVar21,auVar11);
    auVar11 = vpaddd_avx(auVar48,auVar11);
    auVar48 = vprold_avx512vl(auVar10 ^ auVar30,0x18);
    auVar47 = vprold_avx512vl(auVar20 ^ auVar47,0x18);
    auVar19 = vpaddd_avx(auVar48,auVar19);
    auVar10 = vpaddd_avx(auVar47,auVar16);
    auVar42 = vprold_avx512vl(auVar10 ^ auVar42,0x19);
    auVar12 = vpaddd_avx(auVar42,auVar13);
    auVar13 = vpaddd_avx(auVar12,auVar49);
    auVar49 = vprold_avx512vl(auVar23 ^ auVar24,0x19);
    auVar14 = vpaddd_avx(auVar14,auVar49);
    auVar20 = vpaddd_avx512vl(auVar14,auVar28);
    auVar24 = vprold_avx512vl(auVar19 ^ auVar17,0x19);
    auVar16 = vpaddd_avx(auVar22,auVar24);
    auVar22 = vpaddd_avx512vl(auVar16,auVar38);
    auVar21 = vprold_avx512vl(auVar21,0x10);
    auVar38 = vprold_avx512vl(auVar14 ^ auVar46,0x10);
    auVar14 = vpaddd_avx(auVar10,auVar21);
    auVar19 = vpaddd_avx(auVar19,auVar38);
    auVar25 = vprold_avx512vl(auVar14 ^ auVar45,0x14);
    auVar49 = vprold_avx512vl(auVar49 ^ auVar19,0x14);
    auVar17 = vpaddd_avx(auVar11,auVar25);
    auVar46 = vpaddd_avx(auVar20,auVar49);
    auVar20 = vprold_avx512vl(auVar46 ^ auVar38,0x18);
    auVar19 = vpaddd_avx(auVar20,auVar19);
    auVar10 = vpxord_avx512vl(auVar19,auVar17);
    auVar48 = vprold_avx512vl(auVar12 ^ auVar48,0x10);
    auVar11 = vprold_avx512vl(auVar47 ^ auVar16,0x10);
    auVar16 = vpaddd_avx(auVar23,auVar48);
    auVar15 = vpaddd_avx(auVar15,auVar11);
    auVar47 = vprold_avx512vl(auVar42 ^ auVar16,0x14);
    auVar42 = vprold_avx512vl(auVar15 ^ auVar24,0x14);
    auVar13 = vpaddd_avx(auVar47,auVar13);
    auVar45 = vpaddd_avx(auVar22,auVar42);
    auVar22 = vprold_avx512vl(auVar45 ^ auVar11,0x18);
    auVar15 = vpaddd_avx(auVar22,auVar15);
    auVar11 = vpxord_avx512vl(auVar15,auVar13);
    auVar21 = vprold_avx512vl(auVar21 ^ auVar17,0x18);
    auVar17 = vpaddd_avx(auVar14,auVar21);
    auVar12 = vpxord_avx512vl(auVar17,auVar46);
    auVar14 = vprold_avx512vl(auVar13 ^ auVar48,0x18);
    auVar16 = vpaddd_avx(auVar14,auVar16);
    auVar13 = vpxord_avx512vl(auVar16,auVar45);
    auVar15 = vprold_avx512vl(auVar15 ^ auVar42,0x19);
    auVar14 = vpxord_avx512vl(auVar14,auVar15);
    auVar15 = vprold_avx512vl(auVar17 ^ auVar25,0x19);
    auVar15 = vpxord_avx512vl(auVar20,auVar15);
    auVar16 = vprold_avx512vl(auVar47 ^ auVar16,0x19);
    auVar16 = vpxord_avx512vl(auVar16,auVar22);
    auVar19 = vprold_avx512vl(auVar49 ^ auVar19,0x19);
    auVar17 = vpxord_avx512vl(auVar19,auVar21);
    sVar5 = sVar5 + 1;
    bVar7 = flags;
  }
  auVar18 = vpunpckldq_avx512vl(auVar10,auVar11);
  auVar50 = vpunpckhdq_avx512vl(auVar10,auVar11);
  auVar19 = vpunpckldq_avx512vl(auVar12,auVar13);
  auVar12 = vpunpckhdq_avx512vl(auVar12,auVar13);
  auVar10 = vpunpcklqdq_avx(auVar18,auVar19);
  auVar18 = vpunpckhqdq_avx(auVar18,auVar19);
  auVar11 = vpunpcklqdq_avx(auVar50,auVar12);
  auVar50 = vpunpckhqdq_avx(auVar50,auVar12);
  auVar19 = vpunpckldq_avx512vl(auVar14,auVar15);
  auVar15 = vpunpckhdq_avx512vl(auVar14,auVar15);
  auVar13 = vpunpckldq_avx512vl(auVar16,auVar17);
  auVar14 = vpunpckhdq_avx512vl(auVar16,auVar17);
  auVar12 = vpunpcklqdq_avx(auVar19,auVar13);
  auVar19 = vpunpckhqdq_avx(auVar19,auVar13);
  auVar13 = vpunpcklqdq_avx(auVar15,auVar14);
  auVar15 = vpunpckhqdq_avx(auVar15,auVar14);
  *(undefined1 (*) [16])out = auVar10;
  *(undefined1 (*) [16])(out + 0x10) = auVar12;
  *(undefined1 (*) [16])(out + 0x20) = auVar18;
  *(undefined1 (*) [16])(out + 0x30) = auVar19;
  *(undefined1 (*) [16])(out + 0x40) = auVar11;
  *(undefined1 (*) [16])(out + 0x50) = auVar13;
  *(undefined1 (*) [16])(out + 0x60) = auVar50;
  *(undefined1 (*) [16])(out + 0x70) = auVar15;
  return;
}

Assistant:

void blake3_hash4_sse2(const uint8_t *const *inputs, size_t blocks,
                       const uint32_t key[8], uint64_t counter,
                       bool increment_counter, uint8_t flags,
                       uint8_t flags_start, uint8_t flags_end, uint8_t *out) {
  __m128i h_vecs[8] = {
      set1(key[0]), set1(key[1]), set1(key[2]), set1(key[3]),
      set1(key[4]), set1(key[5]), set1(key[6]), set1(key[7]),
  };
  __m128i counter_low_vec, counter_high_vec;
  load_counters(counter, increment_counter, &counter_low_vec,
                &counter_high_vec);
  uint8_t block_flags = flags | flags_start;

  for (size_t block = 0; block < blocks; block++) {
    if (block + 1 == blocks) {
      block_flags |= flags_end;
    }
    __m128i block_len_vec = set1(BLAKE3_BLOCK_LEN);
    __m128i block_flags_vec = set1(block_flags);
    __m128i msg_vecs[16];
    transpose_msg_vecs(inputs, block * BLAKE3_BLOCK_LEN, msg_vecs);

    __m128i v[16] = {
        h_vecs[0],       h_vecs[1],        h_vecs[2],     h_vecs[3],
        h_vecs[4],       h_vecs[5],        h_vecs[6],     h_vecs[7],
        set1(IV[0]),     set1(IV[1]),      set1(IV[2]),   set1(IV[3]),
        counter_low_vec, counter_high_vec, block_len_vec, block_flags_vec,
    };
    round_fn(v, msg_vecs, 0);
    round_fn(v, msg_vecs, 1);
    round_fn(v, msg_vecs, 2);
    round_fn(v, msg_vecs, 3);
    round_fn(v, msg_vecs, 4);
    round_fn(v, msg_vecs, 5);
    round_fn(v, msg_vecs, 6);
    h_vecs[0] = xorv(v[0], v[8]);
    h_vecs[1] = xorv(v[1], v[9]);
    h_vecs[2] = xorv(v[2], v[10]);
    h_vecs[3] = xorv(v[3], v[11]);
    h_vecs[4] = xorv(v[4], v[12]);
    h_vecs[5] = xorv(v[5], v[13]);
    h_vecs[6] = xorv(v[6], v[14]);
    h_vecs[7] = xorv(v[7], v[15]);

    block_flags = flags;
  }

  transpose_vecs(&h_vecs[0]);
  transpose_vecs(&h_vecs[4]);
  // The first four vecs now contain the first half of each output, and the
  // second four vecs contain the second half of each output.
  storeu(h_vecs[0], &out[0 * sizeof(__m128i)]);
  storeu(h_vecs[4], &out[1 * sizeof(__m128i)]);
  storeu(h_vecs[1], &out[2 * sizeof(__m128i)]);
  storeu(h_vecs[5], &out[3 * sizeof(__m128i)]);
  storeu(h_vecs[2], &out[4 * sizeof(__m128i)]);
  storeu(h_vecs[6], &out[5 * sizeof(__m128i)]);
  storeu(h_vecs[3], &out[6 * sizeof(__m128i)]);
  storeu(h_vecs[7], &out[7 * sizeof(__m128i)]);
}